

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void funcinfo(lua_Debug *ar,Closure *cl)

{
  char *pcVar1;
  size_t in_RSI;
  char *in_RDI;
  char *unaff_retaddr;
  
  if (*(char *)(in_RSI + 10) == '\0') {
    *(long *)(in_RDI + 0x20) = *(long *)(*(long *)(in_RSI + 0x20) + 0x40) + 0x18;
    *(undefined4 *)(in_RDI + 0x30) = *(undefined4 *)(*(long *)(in_RSI + 0x20) + 0x60);
    *(undefined4 *)(in_RDI + 0x34) = *(undefined4 *)(*(long *)(in_RSI + 0x20) + 100);
    pcVar1 = "Lua";
    if (*(int *)(in_RDI + 0x30) == 0) {
      pcVar1 = "main";
    }
    *(char **)(in_RDI + 0x18) = pcVar1;
  }
  else {
    *(char **)(in_RDI + 0x20) = "=[C]";
    in_RDI[0x30] = -1;
    in_RDI[0x31] = -1;
    in_RDI[0x32] = -1;
    in_RDI[0x33] = -1;
    in_RDI[0x34] = -1;
    in_RDI[0x35] = -1;
    in_RDI[0x36] = -1;
    in_RDI[0x37] = -1;
    *(char **)(in_RDI + 0x18) = "C";
  }
  luaO_chunkid(unaff_retaddr,in_RDI,in_RSI);
  return;
}

Assistant:

static void funcinfo(lua_Debug*ar,Closure*cl){
if(cl->c.isC){
ar->source="=[C]";
ar->linedefined=-1;
ar->lastlinedefined=-1;
ar->what="C";
}
else{
ar->source=getstr(cl->l.p->source);
ar->linedefined=cl->l.p->linedefined;
ar->lastlinedefined=cl->l.p->lastlinedefined;
ar->what=(ar->linedefined==0)?"main":"Lua";
}
luaO_chunkid(ar->short_src,ar->source,60);
}